

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

void RunDeadCodeElimiation(ExpressionContext *ctx,VmModule *module,VmFunction *function)

{
  VmBlock *pVVar1;
  VmValue *pVVar2;
  VmBlock *this;
  VmFunction *module_00;
  bool bVar3;
  uint uVar4;
  VmValue **ppVVar5;
  VmInstruction *pVVar6;
  VmBlock *local_98;
  VmBlock *curr_5;
  VmBlock *next_1;
  VmBlock *curr;
  VmValue *edge;
  VmValue *option;
  uint i_1;
  VmInstruction *inst_1;
  VmBlock *next;
  VmBlock *curr_4;
  VmBlock *curr_3;
  VmInstruction *inst;
  VmValue *user;
  VmBlock *pVStack_30;
  uint i;
  VmBlock *curr_2;
  VmBlock *curr_1;
  VmFunction *function_local;
  VmModule *module_local;
  ExpressionContext *ctx_local;
  
  if (function->firstBlock != (VmBlock *)0x0) {
    curr_1 = (VmBlock *)function;
    function_local = (VmFunction *)module;
    module_local = (VmModule *)ctx;
    for (curr_2 = function->firstBlock; curr_2 != (VmBlock *)0x0; curr_2 = curr_2->nextSibling) {
      SmallArray<VmBlock_*,_4U>::clear(&curr_2->predecessors);
      SmallArray<VmBlock_*,_4U>::clear(&curr_2->successors);
    }
    for (pVStack_30 = curr_1->prevSibling; pVStack_30 != (VmBlock *)0x0;
        pVStack_30 = pVStack_30->nextSibling) {
      for (user._4_4_ = 0;
          uVar4 = SmallArray<VmValue_*,_8U>::size(&(pVStack_30->super_VmValue).users),
          user._4_4_ < uVar4; user._4_4_ = user._4_4_ + 1) {
        ppVVar5 = SmallArray<VmValue_*,_8U>::operator[]
                            (&(pVStack_30->super_VmValue).users,user._4_4_);
        pVVar6 = getType<VmInstruction>(*ppVVar5);
        if ((pVVar6 != (VmInstruction *)0x0) && (pVVar6->cmd != VM_INST_PHI)) {
          SmallArray<VmBlock_*,_4U>::push_back(&pVStack_30->predecessors,&pVVar6->parent);
          SmallArray<VmBlock_*,_4U>::push_back(&pVVar6->parent->successors,&stack0xffffffffffffffd0)
          ;
        }
      }
    }
    for (curr_4 = curr_1->prevSibling; curr_4 != (VmBlock *)0x0; curr_4 = curr_4->nextSibling) {
      curr_4->visited = false;
    }
    MarkReachableBlocks(curr_1->prevSibling);
    pVVar1 = curr_1->prevSibling->nextSibling;
    while (next = pVVar1, next != (VmBlock *)0x0) {
      pVVar1 = next->nextSibling;
      if ((next->visited & 1U) == 0) {
LAB_0035b5a3:
        bVar3 = SmallArray<VmValue_*,_8U>::empty(&(next->super_VmValue).users);
        if (((bVar3 ^ 0xffU) & 1) != 0) {
          ppVVar5 = SmallArray<VmValue_*,_8U>::back(&(next->super_VmValue).users);
          pVVar6 = getType<VmInstruction>(*ppVVar5);
          if (pVVar6->cmd == VM_INST_JUMP) {
            VmBlock::RemoveInstruction(pVVar6->parent,pVVar6);
          }
          else if ((pVVar6->cmd == VM_INST_JUMP_NZ) || (pVVar6->cmd == VM_INST_JUMP_Z)) {
            ppVVar5 = SmallArray<VmValue_*,_4U>::operator[](&pVVar6->arguments,1);
            module_00 = function_local;
            if ((VmBlock *)*ppVVar5 == next) {
              ppVVar5 = SmallArray<VmValue_*,_4U>::operator[](&pVVar6->arguments,2);
              anon_unknown.dwarf_1a3010::ChangeInstructionTo
                        ((VmModule *)module_00,pVVar6,VM_INST_JUMP,*ppVVar5,(VmValue *)0x0,
                         (VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,(uint *)0x0);
            }
            else {
              ppVVar5 = SmallArray<VmValue_*,_4U>::operator[](&pVVar6->arguments,1);
              anon_unknown.dwarf_1a3010::ChangeInstructionTo
                        ((VmModule *)module_00,pVVar6,VM_INST_JUMP,*ppVVar5,(VmValue *)0x0,
                         (VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,(uint *)0x0);
            }
          }
          else if (pVVar6->cmd == VM_INST_PHI) {
            for (option._4_4_ = 0; uVar4 = SmallArray<VmValue_*,_4U>::size(&pVVar6->arguments),
                option._4_4_ < uVar4; option._4_4_ = option._4_4_ + 2) {
              ppVVar5 = SmallArray<VmValue_*,_4U>::operator[](&pVVar6->arguments,option._4_4_);
              pVVar2 = *ppVVar5;
              ppVVar5 = SmallArray<VmValue_*,_4U>::operator[](&pVVar6->arguments,option._4_4_ + 1);
              this = (VmBlock *)*ppVVar5;
              if (this == next) {
                VmValue::RemoveUse(pVVar2,&pVVar6->super_VmValue);
                VmValue::RemoveUse((VmValue *)this,&pVVar6->super_VmValue);
                uVar4 = SmallArray<VmValue_*,_4U>::size(&pVVar6->arguments);
                ppVVar5 = SmallArray<VmValue_*,_4U>::operator[](&pVVar6->arguments,uVar4 - 2);
                pVVar2 = *ppVVar5;
                ppVVar5 = SmallArray<VmValue_*,_4U>::operator[](&pVVar6->arguments,option._4_4_);
                *ppVVar5 = pVVar2;
                uVar4 = SmallArray<VmValue_*,_4U>::size(&pVVar6->arguments);
                ppVVar5 = SmallArray<VmValue_*,_4U>::operator[](&pVVar6->arguments,uVar4 - 1);
                pVVar2 = *ppVVar5;
                ppVVar5 = SmallArray<VmValue_*,_4U>::operator[](&pVVar6->arguments,option._4_4_ + 1)
                ;
                *ppVVar5 = pVVar2;
                SmallArray<VmValue_*,_4U>::pop_back(&pVVar6->arguments);
                SmallArray<VmValue_*,_4U>::pop_back(&pVVar6->arguments);
                break;
              }
            }
          }
          goto LAB_0035b5a3;
        }
      }
    }
    next_1 = curr_1->prevSibling;
    while (next_1 != (VmBlock *)0x0) {
      pVVar1 = next_1->nextSibling;
      RunDeadCodeElimiation((ExpressionContext *)module_local,(VmModule *)function_local,next_1);
      next_1 = pVVar1;
    }
    for (local_98 = curr_1->prevSibling; local_98 != (VmBlock *)0x0;
        local_98 = local_98->nextSibling) {
      if ((local_98->visited & 1U) == 0) {
        __assert_fail("curr->visited",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                      ,0x1352,
                      "void RunDeadCodeElimiation(ExpressionContext &, VmModule *, VmFunction *)");
      }
      local_98->visited = false;
    }
  }
  return;
}

Assistant:

void RunDeadCodeElimiation(ExpressionContext &ctx, VmModule *module, VmFunction* function)
{
	if(!function->firstBlock)
		return;

	for(VmBlock *curr = function->firstBlock; curr; curr = curr->nextSibling)
	{
		curr->predecessors.clear();
		curr->successors.clear();
	}

	// Get block predecessors and successors
	for(VmBlock *curr = function->firstBlock; curr; curr = curr->nextSibling)
	{
		for(unsigned i = 0; i < curr->users.size(); i++)
		{
			VmValue *user = curr->users[i];

			if(VmInstruction *inst = getType<VmInstruction>(user))
			{
				if(inst->cmd != VM_INST_PHI)
				{
					curr->predecessors.push_back(inst->parent);
					inst->parent->successors.push_back(curr);
				}
			}
		}
	}

	for(VmBlock *curr = function->firstBlock; curr; curr = curr->nextSibling)
		curr->visited = false;

	MarkReachableBlocks(function->firstBlock);

	// Remove blocks that are unreachable from entry
	for(VmBlock *curr = function->firstBlock->nextSibling; curr;)
	{
		VmBlock *next = curr->nextSibling;

		if(!curr->visited)
		{
			while(!curr->users.empty())
			{
				VmInstruction *inst = getType<VmInstruction>(curr->users.back());

				if(inst->cmd == VM_INST_JUMP)
				{
					inst->parent->RemoveInstruction(inst);
				}
				else if(inst->cmd == VM_INST_JUMP_NZ || inst->cmd == VM_INST_JUMP_Z)
				{
					if(inst->arguments[1] == curr)
						ChangeInstructionTo(module, inst, VM_INST_JUMP, inst->arguments[2], NULL, NULL, NULL, NULL, NULL);
					else
						ChangeInstructionTo(module, inst, VM_INST_JUMP, inst->arguments[1], NULL, NULL, NULL, NULL, NULL);
				}
				else if(inst->cmd == VM_INST_PHI)
				{
					for(unsigned i = 0; i < inst->arguments.size(); i += 2)
					{
						VmValue *option = inst->arguments[i];
						VmValue *edge = inst->arguments[i + 1];

						if(edge == curr)
						{
							option->RemoveUse(inst);
							edge->RemoveUse(inst);

							inst->arguments[i] = inst->arguments[inst->arguments.size() - 2];
							inst->arguments[i + 1] = inst->arguments[inst->arguments.size() - 1];

							inst->arguments.pop_back();
							inst->arguments.pop_back();

							break;
						}
					}
				}
			}
		}

		curr = next;
	}

	VmBlock *curr = function->firstBlock;

	while(curr)
	{
		VmBlock *next = curr->nextSibling;
		RunDeadCodeElimiation(ctx, module, curr);
		curr = next;
	}

	for(VmBlock *curr = function->firstBlock; curr; curr = curr->nextSibling)
	{
		// Check that only reachable blocks remain
		assert(curr->visited);

		curr->visited = false;
	}
}